

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxweightst.h
# Opt level: O2

void __thiscall
soplex::SPxWeightST<double>::SPxWeightST(SPxWeightST<double> *this,SPxWeightST<double> *old)

{
  Array<double> *this_00;
  Array<double> *this_01;
  
  (this->super_SPxStarter<double>).m_name = (old->super_SPxStarter<double>).m_name;
  (this->super_SPxStarter<double>)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_SPxStarter<double>)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_SPxStarter<double>)._vptr_SPxStarter = (_func_int **)&PTR__SPxWeightST_00334e08;
  DataArray<int>::DataArray(&this->forbidden,&old->forbidden);
  this_00 = &this->rowWeight;
  Array<double>::Array(this_00,&old->rowWeight);
  this_01 = &this->colWeight;
  Array<double>::Array(this_01,&old->colWeight);
  DataArray<bool>::DataArray(&this->rowRight,&old->rowRight);
  DataArray<bool>::DataArray(&this->colUp,&old->colUp);
  if (old->weight == &old->colWeight) {
    this->weight = this_01;
    this->coWeight = this_00;
  }
  else if (old->weight == &old->rowWeight) {
    this->weight = this_00;
    this->coWeight = this_01;
  }
  else {
    this->weight = (Array<double> *)0x0;
    this->coWeight = (Array<double> *)0x0;
  }
  return;
}

Assistant:

SPxWeightST(const SPxWeightST& old)
      : SPxStarter<R>(old)
      , forbidden(old.forbidden)
      , rowWeight(old.rowWeight)
      , colWeight(old.colWeight)
      , rowRight(old.rowRight)
      , colUp(old.colUp)
   {
      if(old.weight == &old.colWeight)
      {
         weight   = &colWeight;
         coWeight = &rowWeight;
      }
      else if(old.weight == &old.rowWeight)
      {
         weight   = &rowWeight;
         coWeight = &colWeight;
      }
      else  // old.weight and old.coWeight are not set correctly, do nothing.
      {
         weight = nullptr;
         coWeight = nullptr;
      }

      assert(isConsistent());
   }